

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void terminal_alloc(EditLine *el,termcapstr *t,char *cap)

{
  char cVar1;
  char **ppcVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  char termbuf [2048];
  char local_838 [2056];
  
  ppcVar2 = (el->el_terminal).t_str;
  lVar8 = (long)(t + -0x12655) >> 1;
  memset(local_838,0,0x800);
  if ((cap == (char *)0x0) || (*cap == '\0')) {
    *(undefined8 *)((long)ppcVar2 + lVar8) = 0;
  }
  else {
    sVar3 = strlen(cap);
    pcVar7 = *(char **)((long)ppcVar2 + lVar8);
    if (pcVar7 == (char *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = strlen(pcVar7);
    }
    if (uVar4 < sVar3) {
      sVar6 = (el->el_terminal).t_loc;
      if (sVar6 + 3 < 0x800) {
        pcVar7 = (el->el_terminal).t_buf + sVar6;
        *(char **)((long)ppcVar2 + lVar8) = pcVar7;
        strcpy(pcVar7,cap);
        sVar6 = (el->el_terminal).t_loc;
      }
      else {
        sVar6 = 0;
        uVar4 = 0;
        do {
          pcVar5 = *(char **)((long)ppcVar2 + uVar4);
          if (((pcVar5 != (char *)0x0) && (pcVar5 != pcVar7)) && (*pcVar5 != '\0')) {
            cVar1 = *pcVar5;
            while (cVar1 != '\0') {
              pcVar5 = pcVar5 + 1;
              local_838[sVar6] = cVar1;
              sVar6 = sVar6 + 1;
              cVar1 = *pcVar5;
            }
            local_838[sVar6] = '\0';
            sVar6 = sVar6 + 1;
          }
          bVar9 = uVar4 < 0x130;
          uVar4 = uVar4 + 8;
        } while (bVar9);
        memcpy((el->el_terminal).t_buf,local_838,0x800);
        (el->el_terminal).t_loc = sVar6;
        if (sVar6 - 0x7fd < 0xfffffffffffff800) {
          fwrite("Out of termcap string space.\n",0x1d,1,(FILE *)el->el_errfile);
          return;
        }
        pcVar7 = (el->el_terminal).t_buf + sVar6;
        *(char **)((long)ppcVar2 + lVar8) = pcVar7;
        strcpy(pcVar7,cap);
        sVar6 = (el->el_terminal).t_loc;
      }
      (el->el_terminal).t_loc = sVar6 + sVar3 + 1;
    }
    else if (pcVar7 != (char *)0x0) {
      strcpy(pcVar7,cap);
      return;
    }
  }
  return;
}

Assistant:

static void
terminal_alloc(EditLine *el, const struct termcapstr *t, const char *cap)
{
	char termbuf[TC_BUFSIZE];
	size_t tlen, clen;
	char **tlist = el->el_terminal.t_str;
	char **tmp, **str = &tlist[t - tstr];

	(void) memset(termbuf, 0, sizeof(termbuf));
	if (cap == NULL || *cap == '\0') {
		*str = NULL;
		return;
	} else
		clen = strlen(cap);

	tlen = *str == NULL ? 0 : strlen(*str);

	/*
         * New string is shorter; no need to allocate space
         */
	if (clen <= tlen) {
		if (*str)
			(void) strcpy(*str, cap);	/* XXX strcpy is safe */
		return;
	}
	/*
         * New string is longer; see if we have enough space to append
         */
	if (el->el_terminal.t_loc + 3 < TC_BUFSIZE) {
						/* XXX strcpy is safe */
		(void) strcpy(*str = &el->el_terminal.t_buf[
		    el->el_terminal.t_loc], cap);
		el->el_terminal.t_loc += clen + 1;	/* one for \0 */
		return;
	}
	/*
         * Compact our buffer; no need to check compaction, cause we know it
         * fits...
         */
	tlen = 0;
	for (tmp = tlist; tmp < &tlist[T_str]; tmp++)
		if (*tmp != NULL && **tmp != '\0' && *tmp != *str) {
			char *ptr;

			for (ptr = *tmp; *ptr != '\0'; termbuf[tlen++] = *ptr++)
				continue;
			termbuf[tlen++] = '\0';
		}
	memcpy(el->el_terminal.t_buf, termbuf, TC_BUFSIZE);
	el->el_terminal.t_loc = tlen;
	if (el->el_terminal.t_loc + 3 >= TC_BUFSIZE) {
		(void) fprintf(el->el_errfile,
		    "Out of termcap string space.\n");
		return;
	}
					/* XXX strcpy is safe */
	(void) strcpy(*str = &el->el_terminal.t_buf[el->el_terminal.t_loc],
	    cap);
	el->el_terminal.t_loc += (size_t)clen + 1;	/* one for \0 */
	return;
}